

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
wasm::WATParser::Lexer::takeString_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  LexStrResult *pLVar2;
  size_type sVar3;
  LexStrResult *this_00;
  allocator<char> local_a9;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_78;
  string_view local_68;
  undefined1 local_58 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> result;
  Lexer *this_local;
  
  result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
  _M_payload.
  super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>.
  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._56_8_ = this;
  local_68 = next(this);
  anon_unknown_0::str((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_58,
                      local_68);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_58);
  if (bVar1) {
    pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_58);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)pLVar2);
    this->pos = this->pos + sVar3;
    advance(this);
    pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_58);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&pLVar2->str);
    if (bVar1) {
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_58
                         );
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(__return_storage_ptr__,&pLVar2->str);
      local_78 = 1;
    }
    else {
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_58
                         );
      this_00 = std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::operator->
                          ((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)
                           local_58);
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
      local_a8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)pLVar2,1,sVar3 - 2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_98,&local_a8,&local_a9);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_a9);
      local_78 = 1;
    }
  }
  else {
    local_78 = 0;
  }
  std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::~optional
            ((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_58);
  if (local_78 == 0) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Lexer::takeString() {
  if (auto result = str(next())) {
    pos += result->span.size();
    advance();
    if (result->str) {
      return result->str;
    }
    // Remove quotes.
    return std::string(result->span.substr(1, result->span.size() - 2));
  }
  return std::nullopt;
}